

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsC.cxx
# Opt level: O3

bool __thiscall
cmDependsC::WriteDependencies
          (cmDependsC *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *sources,string *obj,ostream *makeDepends,ostream *internalDepends)

{
  queue<cmDependsC::UnscannedEntry,_std::deque<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>_>
  *this_00;
  _Base_ptr p_Var1;
  _Elt_pointer pUVar2;
  pointer pcVar3;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar4;
  bool bVar5;
  BOM BVar6;
  const_iterator cVar7;
  iterator iVar8;
  iterator iVar9;
  undefined8 *puVar10;
  iterator iVar11;
  mapped_type *pmVar12;
  ostream *poVar13;
  _Base_ptr p_Var14;
  _Rb_tree_header *p_Var15;
  value_type *__x;
  char *m1;
  string *dir_00;
  string obj_m;
  string fullName;
  string tempPathStr;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  scanned;
  string dir;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dependencies;
  string obj_i;
  ulong local_390;
  key_type local_388;
  long *local_368;
  long local_360;
  long local_358 [2];
  RegularExpression *local_348;
  ostream *local_340;
  ostream *local_338;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_330;
  key_type local_328;
  char *local_308;
  undefined8 local_300;
  char local_2f8;
  undefined7 uStack_2f7;
  cmDependsC *local_2e8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_2e0;
  undefined1 local_2d8 [32];
  _Base_ptr local_2b8;
  size_t local_2b0;
  string *local_2a8;
  _Base_ptr local_2a0;
  _Base_ptr local_298;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines_*>_>_>
  *local_290;
  string local_288;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  undefined1 local_238 [32];
  _Alloc_hider local_218;
  size_type local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208 [29];
  
  local_390 = (sources->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  local_340 = makeDepends;
  local_338 = internalDepends;
  if ((local_390 == 0) ||
     ((sources->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_parent == (_Base_ptr)0x0
     )) {
    m1 = "Cannot scan dependencies without a source file.";
LAB_003f3802:
    cmSystemTools::Error(m1,(char *)0x0,(char *)0x0,(char *)0x0);
    return false;
  }
  if (obj->_M_string_length == 0) {
    m1 = "Cannot scan dependencies without an object file.";
    goto LAB_003f3802;
  }
  local_268._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_268._M_impl.super__Rb_tree_header._M_header;
  local_268._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_268._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_268._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_268._M_impl.super__Rb_tree_header._M_header._M_right =
       local_268._M_impl.super__Rb_tree_header._M_header._M_left;
  if (&this->ValidDeps->_M_t !=
      (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
       *)0x0) {
    cVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
            ::find(&this->ValidDeps->_M_t,obj);
    if ((_Rb_tree_header *)cVar7._M_node != &(this->ValidDeps->_M_t)._M_impl.super__Rb_tree_header)
    {
      p_Var14 = *(_Base_ptr *)(cVar7._M_node + 2);
      p_Var1 = cVar7._M_node[2]._M_parent;
      local_238._0_8_ = &local_268;
      if (p_Var14 != p_Var1) {
        do {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::
          _M_insert_unique_<std::__cxx11::string_const&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&local_268,(const_iterator)&local_268._M_impl.super__Rb_tree_header,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p_Var14,
                     (_Alloc_node *)local_238);
          p_Var14 = p_Var14 + 1;
        } while (p_Var14 != p_Var1);
      }
LAB_003f3e01:
      cmOutputConverter::Convert
                ((string *)local_238,
                 &((this->super_cmDepends).LocalGenerator)->super_cmOutputConverter,obj,HOME_OUTPUT,
                 UNCHANGED);
      cmOutputConverter::ConvertToOutputFormat
                (&local_388,&((this->super_cmDepends).LocalGenerator)->super_cmOutputConverter,
                 (string *)local_238,MAKERULE);
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          (local_338,(char *)local_238._0_8_,local_238._8_8_);
      std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
      std::ostream::put((char)poVar13);
      std::ostream::flush();
      if ((_Rb_tree_header *)local_268._M_impl.super__Rb_tree_header._M_header._M_left !=
          &local_268._M_impl.super__Rb_tree_header) {
        p_Var14 = local_268._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              (local_340,local_388._M_dataplus._M_p,local_388._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,": ",2);
          cmOutputConverter::Convert
                    ((string *)local_2d8,
                     &((this->super_cmDepends).LocalGenerator)->super_cmOutputConverter,
                     (string *)(p_Var14 + 1),HOME_OUTPUT,MAKERULE);
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar13,(char *)local_2d8._0_8_,
                               CONCAT44(local_2d8._12_4_,local_2d8._8_4_));
          std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
          std::ostream::put((char)poVar13);
          std::ostream::flush();
          if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
            operator_delete((void *)local_2d8._0_8_,(ulong)(local_2d8._16_8_ + 1));
          }
          std::__ostream_insert<char,std::char_traits<char>>(local_338," ",1);
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              (local_338,*(char **)(p_Var14 + 1),(long)p_Var14[1]._M_parent);
          std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
          std::ostream::put((char)poVar13);
          std::ostream::flush();
          p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14);
        } while ((_Rb_tree_header *)p_Var14 != &local_268._M_impl.super__Rb_tree_header);
      }
      std::ios::widen((char)local_340->_vptr_basic_ostream[-3] + (char)local_340);
      std::ostream::put((char)local_340);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388._M_dataplus._M_p != &local_388.field_2) {
        operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
      }
      if ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_238._0_8_ !=
          (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)(local_238 + 0x10)) {
        operator_delete((void *)local_238._0_8_,CONCAT71(local_238._17_7_,local_238[0x10]) + 1);
      }
      bVar5 = true;
      goto LAB_003f406c;
    }
    local_390 = (sources->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  }
  local_330 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               *)&this->Encountered;
  local_2e8 = this;
  local_2a8 = obj;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_330);
  p_Var14 = (sources->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var15 = &(sources->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var14 != p_Var15) {
    local_348 = (RegularExpression *)&local_2e8->Unscanned;
    do {
      local_238._8_8_ = 0;
      local_238[0x10] = '\0';
      local_218._M_p = (pointer)local_208;
      local_210 = 0;
      local_208[0]._M_local_buf[0] = '\0';
      local_238._0_8_ =
           (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_238 + 0x10);
      std::__cxx11::string::_M_assign((string *)local_238);
      std::deque<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>::push_back
                ((deque<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_> *)
                 local_348,(value_type *)local_238);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                (local_330,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var14 + 1))
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_p != local_208) {
        operator_delete(local_218._M_p,
                        CONCAT71(local_208[0]._M_allocated_capacity._1_7_,
                                 local_208[0]._M_local_buf[0]) + 1);
      }
      if ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_238._0_8_ !=
          (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)(local_238 + 0x10)) {
        operator_delete((void *)local_238._0_8_,CONCAT71(local_238._17_7_,local_238[0x10]) + 1);
      }
      p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14);
    } while ((_Rb_tree_header *)p_Var14 != p_Var15);
  }
  local_2d8._24_8_ = local_2d8 + 8;
  local_2d8._8_4_ = _S_red;
  local_2d8._16_8_ = (_Base_ptr)0x0;
  local_2b0 = 0;
  local_308 = &local_2f8;
  local_300 = 0;
  local_2f8 = '\0';
  local_2b8 = (_Base_ptr)local_2d8._24_8_;
  std::__cxx11::string::reserve((ulong)&local_308);
  this = local_2e8;
  this_00 = &local_2e8->Unscanned;
  local_2e0 = &local_2e8->HeaderLocationCache;
  local_2a0 = &(local_2e8->HeaderLocationCache)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_348 = &local_2e8->IncludeRegexComplain;
  local_290 = &local_2e8->FileCache;
  local_298 = &(local_2e8->FileCache)._M_t._M_impl.super__Rb_tree_header._M_header;
  psVar4 = &local_2e8->Encountered;
  do {
    pUVar2 = (this->Unscanned).c.
             super__Deque_base<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    if ((this->Unscanned).c.
        super__Deque_base<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_cur == pUVar2) {
      if (local_308 != &local_2f8) {
        operator_delete(local_308,CONCAT71(uStack_2f7,local_2f8) + 1);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_2d8);
      obj = local_2a8;
      goto LAB_003f3e01;
    }
    local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
    pcVar3 = (pUVar2->FileName)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_388,pcVar3,pcVar3 + (pUVar2->FileName)._M_string_length);
    local_368 = local_358;
    pcVar3 = (pUVar2->QuotedLocation)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_368,pcVar3,pcVar3 + (pUVar2->QuotedLocation)._M_string_length);
    std::deque<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>::pop_front
              (&this_00->c);
    local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
    local_328._M_string_length = 0;
    local_328.field_2._M_local_buf[0] = '\0';
    if ((0 < (int)local_390) ||
       (bVar5 = cmsys::SystemTools::FileIsFullPath(local_388._M_dataplus._M_p), bVar5)) {
      bVar5 = cmsys::SystemTools::FileExists(local_388._M_dataplus._M_p,true);
      if (bVar5) goto LAB_003f3a8b;
    }
    else if ((local_360 == 0) ||
            (bVar5 = cmsys::SystemTools::FileExists((char *)local_368,true), !bVar5)) {
      iVar11 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::find(&local_2e0->_M_t,&local_388);
      if (iVar11._M_node == local_2a0) {
        for (dir_00 = (this->super_cmDepends).IncludePath.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            dir_00 != (this->super_cmDepends).IncludePath.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish; dir_00 = dir_00 + 1) {
          cmSystemTools::CollapseCombinedPath((string *)local_238,dir_00,&local_388);
          std::__cxx11::string::operator=((string *)&local_308,(string *)local_238);
          if ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_238._0_8_ !=
              (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_238 + 0x10)) {
            operator_delete((void *)local_238._0_8_,CONCAT71(local_238._17_7_,local_238[0x10]) + 1);
          }
          bVar5 = cmsys::SystemTools::FileExists(local_308,true);
          if (bVar5) {
            std::__cxx11::string::_M_assign((string *)&local_328);
            pmVar12 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[](local_2e0,&local_388);
            std::__cxx11::string::_M_assign((string *)pmVar12);
            break;
          }
        }
      }
      else {
        std::__cxx11::string::_M_assign((string *)&local_328);
      }
    }
    else {
LAB_003f3a8b:
      std::__cxx11::string::_M_assign((string *)&local_328);
    }
    if (local_328._M_string_length == 0) {
      bVar5 = cmsys::RegularExpression::find(local_348,local_388._M_dataplus._M_p);
      if (!bVar5) {
        if (local_328._M_string_length != 0) goto LAB_003f3a9f;
        goto LAB_003f3ac0;
      }
      bVar5 = false;
      cmSystemTools::Error("Cannot find file \"",local_388._M_dataplus._M_p,"\".",(char *)0x0);
    }
    else {
LAB_003f3a9f:
      iVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_2d8,&local_328);
      if (iVar8._M_node == (_Base_ptr)(local_2d8 + 8)) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_2d8,&local_328);
        iVar9 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines_*>_>_>
                ::find(&local_290->_M_t,&local_328);
        if (iVar9._M_node == local_298) {
          std::ifstream::ifstream(local_238,local_328._M_dataplus._M_p,_S_in);
          if (((*(byte *)((long)&(*(_Base_ptr *)(local_238._0_8_ + -0x18))->_M_color +
                         (long)&local_218._M_p) & 5) == 0) &&
             (BVar6 = cmsys::FStream::ReadBOM((istream *)local_238), BVar6 < BOM_UTF16BE)) {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&local_268,&local_328);
            cmsys::SystemTools::GetFilenamePath(&local_288,&local_328);
            Scan(this,(istream *)local_238,local_288._M_dataplus._M_p,&local_328);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_288._M_dataplus._M_p != &local_288.field_2) {
              operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1
                             );
            }
          }
          std::ifstream::~ifstream(local_238);
        }
        else {
          *(undefined1 *)(*(long *)(iVar9._M_node + 2) + 0x18) = 1;
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&local_268,&local_328);
          puVar10 = *(undefined8 **)(iVar9._M_node + 2);
          for (__x = (value_type *)*puVar10; __x != (value_type *)puVar10[1]; __x = __x + 1) {
            iVar8 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_330,&__x->FileName);
            if ((_Rb_tree_header *)iVar8._M_node == &(psVar4->_M_t)._M_impl.super__Rb_tree_header) {
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>(local_330,&__x->FileName);
              std::deque<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>::
              push_back(&this_00->c,__x);
            }
            puVar10 = *(undefined8 **)(iVar9._M_node + 2);
          }
        }
      }
LAB_003f3ac0:
      local_390 = (ulong)((int)local_390 - 1);
      bVar5 = true;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != &local_328.field_2) {
      operator_delete(local_328._M_dataplus._M_p,
                      CONCAT71(local_328.field_2._M_allocated_capacity._1_7_,
                               local_328.field_2._M_local_buf[0]) + 1);
    }
    if (local_368 != local_358) {
      operator_delete(local_368,local_358[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._M_dataplus._M_p != &local_388.field_2) {
      operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
    }
  } while (bVar5);
  if (local_308 != &local_2f8) {
    operator_delete(local_308,CONCAT71(uStack_2f7,local_2f8) + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2d8);
  bVar5 = false;
LAB_003f406c:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_268);
  return bVar5;
}

Assistant:

bool cmDependsC::WriteDependencies(const std::set<std::string>& sources,
                                   const std::string& obj,
                                   std::ostream& makeDepends,
                                   std::ostream& internalDepends)
{
  // Make sure this is a scanning instance.
  if(sources.empty() || sources.begin()->empty())
    {
    cmSystemTools::Error("Cannot scan dependencies without a source file.");
    return false;
    }
  if(obj.empty())
    {
    cmSystemTools::Error("Cannot scan dependencies without an object file.");
    return false;
    }

  std::set<std::string> dependencies;
  bool haveDeps = false;

  if (this->ValidDeps != 0)
    {
    std::map<std::string, DependencyVector>::const_iterator tmpIt =
                                                    this->ValidDeps->find(obj);
    if (tmpIt!= this->ValidDeps->end())
      {
      dependencies.insert(tmpIt->second.begin(), tmpIt->second.end());
      haveDeps = true;
      }
    }

  if (!haveDeps)
    {
    // Walk the dependency graph starting with the source file.
    int srcFiles = (int)sources.size();
    this->Encountered.clear();

    for(std::set<std::string>::const_iterator srcIt = sources.begin();
        srcIt != sources.end(); ++srcIt)
      {
      UnscannedEntry root;
      root.FileName = *srcIt;
      this->Unscanned.push(root);
      this->Encountered.insert(*srcIt);
      }

    std::set<std::string> scanned;

    // Use reserve to allocate enough memory for tempPathStr
    // so that during the loops no memory is allocated or freed
    std::string tempPathStr;
    tempPathStr.reserve(4*1024);

    while(!this->Unscanned.empty())
      {
      // Get the next file to scan.
      UnscannedEntry current = this->Unscanned.front();
      this->Unscanned.pop();

      // If not a full path, find the file in the include path.
      std::string fullName;
      if((srcFiles>0)
         || cmSystemTools::FileIsFullPath(current.FileName.c_str()))
        {
        if(cmSystemTools::FileExists(current.FileName.c_str(), true))
          {
          fullName = current.FileName;
          }
        }
      else if(!current.QuotedLocation.empty() &&
              cmSystemTools::FileExists(current.QuotedLocation.c_str(), true))
        {
        // The include statement producing this entry was a double-quote
        // include and the included file is present in the directory of
        // the source containing the include statement.
        fullName = current.QuotedLocation;
        }
      else
        {
        std::map<std::string, std::string>::iterator
          headerLocationIt=this->HeaderLocationCache.find(current.FileName);
        if (headerLocationIt!=this->HeaderLocationCache.end())
          {
          fullName=headerLocationIt->second;
          }
        else for(std::vector<std::string>::const_iterator i =
              this->IncludePath.begin(); i != this->IncludePath.end(); ++i)
          {
          // Construct the name of the file as if it were in the current
          // include directory.  Avoid using a leading "./".

          tempPathStr =
            cmSystemTools::CollapseCombinedPath(*i, current.FileName);

          // Look for the file in this location.
          if(cmSystemTools::FileExists(tempPathStr.c_str(), true))
            {
            fullName = tempPathStr;
            HeaderLocationCache[current.FileName]=fullName;
            break;
            }
          }
        }

      // Complain if the file cannot be found and matches the complain
      // regex.
      if(fullName.empty() &&
        this->IncludeRegexComplain.find(current.FileName.c_str()))
        {
        cmSystemTools::Error("Cannot find file \"",
                            current.FileName.c_str(), "\".");
        return false;
        }

      // Scan the file if it was found and has not been scanned already.
      if(!fullName.empty() && (scanned.find(fullName) == scanned.end()))
        {
        // Record scanned files.
        scanned.insert(fullName);

        // Check whether this file is already in the cache
        std::map<std::string, cmIncludeLines*>::iterator fileIt=
          this->FileCache.find(fullName);
        if (fileIt!=this->FileCache.end())
          {
          fileIt->second->Used=true;
          dependencies.insert(fullName);
          for (std::vector<UnscannedEntry>::const_iterator incIt=
                fileIt->second->UnscannedEntries.begin();
              incIt!=fileIt->second->UnscannedEntries.end(); ++incIt)
            {
            if (this->Encountered.find(incIt->FileName) ==
                this->Encountered.end())
              {
              this->Encountered.insert(incIt->FileName);
              this->Unscanned.push(*incIt);
              }
            }
          }
        else
          {

          // Try to scan the file.  Just leave it out if we cannot find
          // it.
          cmsys::ifstream fin(fullName.c_str());
          if(fin)
            {
            cmsys::FStream::BOM bom = cmsys::FStream::ReadBOM(fin);
            if(bom == cmsys::FStream::BOM_None ||
               bom == cmsys::FStream::BOM_UTF8)
              {
              // Add this file as a dependency.
              dependencies.insert(fullName);

              // Scan this file for new dependencies.  Pass the directory
              // containing the file to handle double-quote includes.
              std::string dir = cmSystemTools::GetFilenamePath(fullName);
              this->Scan(fin, dir.c_str(), fullName);
              }
            else
              {
              // Skip file with encoding we do not implement.
              }
            }
          }
        }

      srcFiles--;
      }
    }

  // Write the dependencies to the output stream.  Makefile rules
  // written by the original local generator for this directory
  // convert the dependencies to paths relative to the home output
  // directory.  We must do the same here.
  std::string obj_i =
    this->LocalGenerator->Convert(obj, cmLocalGenerator::HOME_OUTPUT);
  std::string obj_m =
    this->LocalGenerator->ConvertToOutputFormat(obj_i,
                                                cmLocalGenerator::MAKERULE);
  internalDepends << obj_i << std::endl;

  for(std::set<std::string>::const_iterator i=dependencies.begin();
      i != dependencies.end(); ++i)
    {
    makeDepends << obj_m << ": " <<
      this->LocalGenerator->Convert(*i,
                                    cmLocalGenerator::HOME_OUTPUT,
                                    cmLocalGenerator::MAKERULE)
                << std::endl;
    internalDepends << " " << *i << std::endl;
    }
  makeDepends << std::endl;

  return true;
}